

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O1

void kratos::fix_assignment_type(Generator *top)

{
  undefined1 local_b8 [8];
  AssignmentTypeVisitor final_visitor;
  AssignmentTypeBlockVisitor visitor;
  
  visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  visitor.super_IRVisitor._8_8_ =
       &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  final_visitor._72_8_ = &PTR_visit_root_002b19e8;
  IRVisitor::visit_root_tp((IRVisitor *)&final_visitor.type_,&top->super_IRNode);
  final_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  final_visitor.super_IRVisitor._8_8_ =
       &final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  final_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  final_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  final_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_b8 = (undefined1  [8])&PTR_visit_root_002b1b48;
  final_visitor.super_IRVisitor.visited_._M_h._M_single_bucket._0_4_ = 0;
  final_visitor.super_IRVisitor.visited_._M_h._M_single_bucket._4_1_ = 0;
  IRVisitor::visit_root_s((IRVisitor *)local_b8,&top->super_IRNode);
  local_b8 = (undefined1  [8])&PTR_visit_root_002ab320;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&final_visitor.super_IRVisitor.level);
  final_visitor._72_8_ = &PTR_visit_root_002ab320;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void fix_assignment_type(Generator* top) {
    // first we fix all the block assignment
    AssignmentTypeBlockVisitor visitor;
    visitor.visit_root_tp(top);

    // then we assign any existing assignment as blocking assignment
    AssignmentTypeVisitor final_visitor(AssignmentType::Blocking, false);
    final_visitor.visit_root_s(top->ast_node());
}